

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Clear_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Clear_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  int i;
  int index;
  pointer message;
  pair<google::sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  pair<const_std::pair<int,_int>,_int> local_90;
  AssertHelper local_80;
  pair<google::sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_78;
  
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  index = 1;
  do {
    local_90 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(index);
    google::
    sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_78,&this_00->rep,&local_90);
    index = index + 1;
  } while (index != 200);
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear(&this_00->rep);
  local_80.data_._0_4_ = 0;
  local_90.first =
       (pair<int,_int>)
       (*(size_type *)
         ((long)&(this->
                 super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.table + 0x40) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_78,"0u","this->ht_.size()",(uint *)&local_80,
             (unsigned_long *)&local_90);
  if ((char)local_78.first.ht == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_78.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      message = (pointer)0xaf1463;
    }
    else {
      message = (local_78.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1b0,(char *)message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_90.first != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_90.first + 8))();
    }
  }
  if (local_78.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_78.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_78.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_78.first.pos.row_begin._M_current)->group);
    }
    operator_delete(local_78.first.pos.row_begin._M_current);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Clear) {
  for (int i = 1; i < 200; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.clear();
  EXPECT_EQ(0u, this->ht_.size());
  // TODO(csilvers): do we want to enforce that the hashtable has or
  // has not shrunk?  It does for dense_* but not sparse_*.
}